

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

void free_StreamsInfo(_7z_stream_info *si)

{
  free_PackInfo((_7z_pack_info *)0x1a9cee);
  free_CodersInfo((_7z_coders_info *)si);
  free_SubStreamsInfo((_7z_substream_info *)0x1a9d08);
  return;
}

Assistant:

static void
free_StreamsInfo(struct _7z_stream_info *si)
{
	free_PackInfo(&(si->pi));
	free_CodersInfo(&(si->ci));
	free_SubStreamsInfo(&(si->ss));
}